

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int mbedtls_ecp_tls_read_point
              (mbedtls_ecp_group *grp,mbedtls_ecp_point *pt,uchar **buf,size_t buf_len)

{
  byte bVar1;
  byte *pbVar2;
  uchar *buf_00;
  uchar *buf_start;
  uchar data_len;
  size_t buf_len_local;
  uchar **buf_local;
  mbedtls_ecp_point *pt_local;
  mbedtls_ecp_group *grp_local;
  
  if (buf_len < 2) {
    grp_local._4_4_ = -0x4f80;
  }
  else {
    pbVar2 = *buf;
    *buf = pbVar2 + 1;
    bVar1 = *pbVar2;
    if ((bVar1 == 0) || (buf_len - 1 < (ulong)bVar1)) {
      grp_local._4_4_ = -0x4f80;
    }
    else {
      buf_00 = *buf;
      *buf = *buf + (int)(uint)bVar1;
      grp_local._4_4_ = mbedtls_ecp_point_read_binary(grp,pt,buf_00,(ulong)bVar1);
    }
  }
  return grp_local._4_4_;
}

Assistant:

int mbedtls_ecp_tls_read_point( const mbedtls_ecp_group *grp, mbedtls_ecp_point *pt,
                        const unsigned char **buf, size_t buf_len )
{
    unsigned char data_len;
    const unsigned char *buf_start;

    /*
     * We must have at least two bytes (1 for length, at least one for data)
     */
    if( buf_len < 2 )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    data_len = *(*buf)++;
    if( data_len < 1 || data_len > buf_len - 1 )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    /*
     * Save buffer start for read_binary and update buf
     */
    buf_start = *buf;
    *buf += data_len;

    return mbedtls_ecp_point_read_binary( grp, pt, buf_start, data_len );
}